

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

void __thiscall
LexerTest_ClassifyFloat_Test::LexerTest_ClassifyFloat_Test(LexerTest_ClassifyFloat_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001d7e10;
  return;
}

Assistant:

TEST(LexerTest, ClassifyFloat) {
  constexpr int signif64 = 52;
  constexpr int signif32 = 23;
  constexpr uint64_t payloadMask64 = (1ull << signif64) - 1;
  constexpr uint32_t payloadMask32 = (1u << signif32) - 1;
  constexpr uint64_t dnanDefault = 1ull << (signif64 - 1);
  constexpr uint32_t fnanDefault = 1u << (signif32 - 1);
  {
    Lexer lexer("340282346638528859811704183484516925440."sv);
    ASSERT_FALSE(lexer.empty());
    ASSERT_TRUE(lexer->getF64());
    EXPECT_TRUE(lexer->getF32());
    EXPECT_EQ(*lexer->getF64(), FLT_MAX);
    EXPECT_EQ(*lexer->getF32(), FLT_MAX);
  }
  {
    Lexer lexer("17976931348623157081452742373170435679807056752584499659891747"
                "68031572607800285387605895586327668781715404589535143824642343"
                "21326889464182768467546703537516986049910576551282076245490090"
                "38932894407586850845513394230458323690322294816580855933212334"
                "8274797826204144723168738177180919299881250404026184124858368"
                "."sv);
    ASSERT_FALSE(lexer.empty());
    ASSERT_TRUE(lexer->getF64());
    ASSERT_TRUE(lexer->getF32());
    EXPECT_EQ(*lexer->getF64(), DBL_MAX);
    EXPECT_EQ(*lexer->getF32(), INFINITY);
  }
  {
    Lexer lexer("nan");
    ASSERT_FALSE(lexer.empty());

    ASSERT_TRUE(lexer->getF64());
    double d = *lexer->getF64();
    EXPECT_TRUE(std::isnan(d));
    EXPECT_FALSE(std::signbit(d));
    uint64_t dbits;
    memcpy(&dbits, &d, sizeof(dbits));
    EXPECT_EQ(dbits & payloadMask64, dnanDefault);

    ASSERT_TRUE(lexer->getF32());
    float f = *lexer->getF32();
    EXPECT_TRUE(std::isnan(f));
    EXPECT_FALSE(std::signbit(f));
    uint32_t fbits;
    memcpy(&fbits, &f, sizeof(fbits));
    EXPECT_EQ(fbits & payloadMask32, fnanDefault);
  }
  {
    Lexer lexer("-nan");
    ASSERT_FALSE(lexer.empty());

    ASSERT_TRUE(lexer->getF64());
    double d = *lexer->getF64();
    EXPECT_TRUE(std::isnan(d));
    EXPECT_TRUE(std::signbit(d));
    uint64_t dbits;
    memcpy(&dbits, &d, sizeof(dbits));
    EXPECT_EQ(dbits & payloadMask64, dnanDefault);

    ASSERT_TRUE(lexer->getF32());
    float f = *lexer->getF32();
    EXPECT_TRUE(std::isnan(f));
    EXPECT_TRUE(std::signbit(f));
    uint32_t fbits;
    memcpy(&fbits, &f, sizeof(fbits));
    EXPECT_EQ(fbits & payloadMask32, fnanDefault);
  }
  {
    Lexer lexer("+nan");
    ASSERT_FALSE(lexer.empty());

    ASSERT_TRUE(lexer->getF64());
    double d = *lexer->getF64();
    EXPECT_TRUE(std::isnan(d));
    EXPECT_FALSE(std::signbit(d));
    uint64_t dbits;
    memcpy(&dbits, &d, sizeof(dbits));
    EXPECT_EQ(dbits & payloadMask64, dnanDefault);

    ASSERT_TRUE(lexer->getF32());
    float f = *lexer->getF32();
    EXPECT_TRUE(std::isnan(f));
    EXPECT_FALSE(std::signbit(f));
    uint32_t fbits;
    memcpy(&fbits, &f, sizeof(fbits));
    EXPECT_EQ(fbits & payloadMask32, fnanDefault);
  }
  {
    Lexer lexer("nan:0x1234");
    ASSERT_FALSE(lexer.empty());

    ASSERT_TRUE(lexer->getF64());
    double d = *lexer->getF64();
    EXPECT_TRUE(std::isnan(d));
    uint64_t dbits;
    memcpy(&dbits, &d, sizeof(dbits));
    EXPECT_EQ(dbits & payloadMask64, 0x1234ull);

    ASSERT_TRUE(lexer->getF32());
    float f = *lexer->getF32();
    EXPECT_TRUE(std::isnan(f));
    uint32_t fbits;
    memcpy(&fbits, &f, sizeof(fbits));
    EXPECT_EQ(fbits & payloadMask32, 0x1234u);
  }
  {
    Lexer lexer("nan:0x7FFFFF");
    ASSERT_FALSE(lexer.empty());

    ASSERT_TRUE(lexer->getF64());
    double d = *lexer->getF64();
    EXPECT_TRUE(std::isnan(d));
    uint64_t dbits;
    memcpy(&dbits, &d, sizeof(dbits));
    EXPECT_EQ(dbits & payloadMask64, 0x7fffffull);

    ASSERT_TRUE(lexer->getF32());
    float f = *lexer->getF32();
    EXPECT_TRUE(std::isnan(f));
    uint32_t fbits;
    memcpy(&fbits, &f, sizeof(fbits));
    EXPECT_EQ(fbits & payloadMask32, 0x7fffffu);
  }
  {
    Lexer lexer("nan:0x800000");
    ASSERT_FALSE(lexer.empty());

    ASSERT_TRUE(lexer->getF64());
    double d = *lexer->getF64();
    EXPECT_TRUE(std::isnan(d));
    uint64_t dbits;
    memcpy(&dbits, &d, sizeof(dbits));
    EXPECT_EQ(dbits & payloadMask64, 0x800000ull);

    ASSERT_FALSE(lexer->getF32());
  }
  {
    Lexer lexer("nan:0x0");
    ASSERT_FALSE(lexer.empty());

    ASSERT_FALSE(lexer->getF64());
    ASSERT_FALSE(lexer->getF32());
  }
}